

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int add_path(char *path,int l)

{
  char *pcVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  iVar5 = incpathCount;
  lVar8 = (long)incpathCount;
  lVar6 = (long)str_offsetCount;
  if (incpathCount < str_offsetCount) {
LAB_0010c78e:
    iVar3 = incpathSize;
    piVar2 = str_offset;
    iVar4 = incpathSize - remaining;
    str_offset[lVar8] = iVar4;
    iVar7 = remaining;
    if (remaining < l) {
      incpathSize = (iVar3 + l & 0xfffffff0U) + 0x10;
      iVar7 = incpathSize - iVar3;
      remaining = iVar7;
      incpath = (char *)realloc(incpath,(long)incpathSize);
      if (incpath == (char *)0x0) goto LAB_0010c81d;
      iVar4 = piVar2[lVar8];
    }
    pcVar1 = incpath;
    remaining = iVar7 - l;
    strncpy(incpath + iVar4,path,(long)l);
    pcVar1[(long)piVar2[lVar8] + (long)l + -1] = '\0';
    incpathCount = iVar5 + 1;
    iVar5 = 1;
  }
  else {
    str_offsetCount = str_offsetCount + 0x10;
    str_offset = (int *)realloc(str_offset,lVar6 * 4 + 0x40);
    if (str_offset != (int *)0x0) goto LAB_0010c78e;
LAB_0010c81d:
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
add_path(char* path, int l)
{
	/* Expand str_offset array if needed */
	if(incpathCount >= str_offsetCount)
	{
		str_offsetCount += INCREMENT_BASE;
		str_offset = (int*)realloc(str_offset, str_offsetCount * sizeof(int));
		if(str_offset == NULL)
			return 0;
	}

	/* Initialize string offset */
	str_offset[incpathCount] = incpathSize - remaining;

	/* Realloc string buffer if needed */
	if(remaining < l)
	{
		remaining  = incpathSize;
		/* evil trick, get the greater multiple of INCREMENT_BASE closer 
		   to (size + l). Note : this only works for INCREMENT_BASE = 2^n*/
		incpathSize = ((incpathSize + l) + INCREMENT_BASE) & ~INCREMENT_BASE_MASK;
		remaining  = incpathSize - remaining;
		incpath = (char*)realloc(incpath, incpathSize);
		if(incpath == NULL)
			return 0;
	}
		
	remaining -= l;

	/* Copy path */
	strncpy(incpath + str_offset[incpathCount], path, l);
	incpath[str_offset[incpathCount] + l - 1] = '\0';
	
	++incpathCount;
	
	return 1;
}